

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFAcceleratorTable.cpp
# Opt level: O0

Optional<unsigned_long> __thiscall llvm::DWARFDebugNames::Entry::getCUOffset(Entry *this)

{
  ulong uVar1;
  NameIndex *this_00;
  bool bVar2;
  uint32_t uVar3;
  unsigned_long *puVar4;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar5;
  Optional<unsigned_long> OVar6;
  uint64_t local_38;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 local_30;
  Optional<unsigned_long> Index;
  Entry *this_local;
  bool local_10;
  
  Index.Storage._8_8_ = this;
  OVar6 = getCUIndex(this);
  local_30 = OVar6.Storage.field_0;
  Index.Storage.field_0.empty = OVar6.Storage.hasVal;
  bVar2 = llvm::Optional::operator_cast_to_bool((Optional *)&local_30.empty);
  if (bVar2) {
    puVar4 = Optional<unsigned_long>::operator*((Optional<unsigned_long> *)&local_30);
    uVar1 = *puVar4;
    uVar3 = NameIndex::getCUCount(this->NameIdx);
    if (uVar1 < uVar3) {
      this_00 = this->NameIdx;
      puVar4 = Optional<unsigned_long>::operator*((Optional<unsigned_long> *)&local_30);
      local_38 = NameIndex::getCUOffset(this_00,(uint32_t)*puVar4);
      Optional<unsigned_long>::Optional((Optional<unsigned_long> *)&this_local,&local_38);
      uVar5 = extraout_RDX_00;
      goto LAB_01fc3776;
    }
  }
  Optional<unsigned_long>::Optional((Optional<unsigned_long> *)&this_local,None);
  uVar5 = extraout_RDX;
LAB_01fc3776:
  OVar6.Storage._9_7_ = (undefined7)((ulong)uVar5 >> 8);
  OVar6.Storage.hasVal = local_10;
  OVar6.Storage.field_0 =
       (anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2)this_local;
  return (Optional<unsigned_long>)OVar6.Storage;
}

Assistant:

Optional<uint64_t> DWARFDebugNames::Entry::getCUOffset() const {
  Optional<uint64_t> Index = getCUIndex();
  if (!Index || *Index >= NameIdx->getCUCount())
    return None;
  return NameIdx->getCUOffset(*Index);
}